

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int __thiscall json::Json::init(Json *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Node *A;
  Type TVar2;
  runtime_error *prVar3;
  undefined1 local_70 [8];
  undefined1 local_68 [8];
  _Rb_tree_node_base local_60;
  size_t local_40;
  vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_> local_38;
  
  if (*ctx != (EVP_PKEY_CTX)0x1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70 = (undefined1  [8])&local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"invalid format","");
    std::runtime_error::runtime_error(prVar3,(string *)local_70);
    *(undefined ***)prVar3 = &PTR__runtime_error_00128d40;
    __cxa_throw(prVar3,&JsonError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(int *)(ctx + 8) == 1) {
    A = *(Node **)(ctx + 0x10);
    iVar1 = (A->production).nonTerminal;
    if (iVar1 == 3) {
      createArray((Array *)local_70,A);
      local_38.
      super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (this->array).fields.
           super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_38.
      super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (this->array).fields.
           super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_38.
      super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (this->array).fields.
           super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->array).fields.
      super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68;
      (this->array).fields.
      super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_60._0_8_;
      (this->array).fields.
      super__Vector_base<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_60._M_parent;
      local_68 = (undefined1  [8])0x0;
      local_60._0_8_ = (pointer)0x0;
      local_60._M_parent = (_Base_ptr)0x0;
      std::vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>::
      ~vector(&local_38);
      local_70 = (undefined1  [8])&PTR_clone_00128cd0;
      std::vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>::
      ~vector((vector<common::XPtr<json::Type>,_common::clean_allocator<common::XPtr<json::Type>_>_>
               *)local_68);
      TVar2 = IsArray;
    }
    else {
      if (iVar1 != 2) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_70 = (undefined1  [8])&local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"invalid format","");
        std::runtime_error::runtime_error(prVar3,(string *)local_70);
        *(undefined ***)prVar3 = &PTR__runtime_error_00128d40;
        __cxa_throw(prVar3,&JsonError::typeinfo,std::runtime_error::~runtime_error);
      }
      createObject((Object *)local_70,A);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
      ::clear(&(this->object).fields._M_t);
      if (local_60._M_parent != (_Base_ptr)0x0) {
        (this->object).fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             local_60._M_color;
        (this->object).fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_60._M_parent;
        (this->object).fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             local_60._M_left;
        (this->object).fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_right;
        (local_60._M_parent)->_M_parent =
             &(this->object).fields._M_t._M_impl.super__Rb_tree_header._M_header;
        (this->object).fields._M_t._M_impl.super__Rb_tree_header._M_node_count = local_40;
        local_60._M_parent = (_Base_ptr)0x0;
        local_40 = 0;
        local_60._M_left = &local_60;
        local_60._M_right = &local_60;
      }
      local_70 = (undefined1  [8])&PTR_clone_00128c98;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_common::clean_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>_>
                   *)local_68);
      TVar2 = IsObject;
    }
    this->type = TVar2;
    return TVar2;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_70 = (undefined1  [8])&local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"invalid format","");
  std::runtime_error::runtime_error(prVar3,(string *)local_70);
  *(undefined ***)prVar3 = &PTR__runtime_error_00128d40;
  __cxa_throw(prVar3,&JsonError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void init(parser::Node const& J) {
            if (J.isProduction())
                if (rules::Json == J.getProduction().nonTerminal) {
                    parser::Node const& OorA = J.getProduction().nodes.front();
                    if (rules::Object == OorA.getProduction().nonTerminal) {
                        object = createObject(OorA);
                        type = IsObject;
                    } else if (rules::Array == OorA.getProduction().nonTerminal) {
                        array = createArray(OorA);
                        type = IsArray;
                    } else {
                        throw JsonError("invalid format");
                    }
                } else {
                    throw JsonError("invalid format");
                }
            else
                throw JsonError("invalid format");
        }